

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

double bsc_L(bsc_request_t type)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  
  if ((s_L[0] == 0.0) && (!NAN(s_L[0]))) {
    pdVar1 = s_L;
    for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 4) {
      dVar3 = load_param((char *)((long)&DAT_00118250 + (long)*(int *)((long)&DAT_00118250 + lVar2))
                         ,10000.0,"bsc_L");
      *pdVar1 = dVar3;
      pdVar1 = pdVar1 + 1;
    }
  }
  return s_L[type];
}

Assistant:

double bsc_L(bsc_request_t type)
{
    if ( s_L[0] == 0.0 ) {
        load_param_L_once();
    }
    return s_L[type];
}